

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

bool __thiscall
QScroller::handleInput(QScroller *this,Input input,QPointF *position,qint64 timestamp)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  QScrollerPrivate *pQVar4;
  QDebug *o;
  char *in_RCX;
  long lVar5;
  State in_ESI;
  long in_FS_OFFSET;
  statechange *sc;
  int i;
  QScrollerPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  statechange statechanges [6];
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  QPointF *p1;
  QMessageLogger *in_stack_fffffffffffffeb0;
  QDebug *in_stack_fffffffffffffeb8;
  int local_124;
  bool local_f1;
  QPointF local_f0 [3];
  QDebug local_c0;
  QDebug local_b8;
  QDebug local_b0;
  undefined1 *local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  State local_98 [2];
  ulong auStack_90 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QScroller *)0xa850e9);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = 0xaa;
  uStack_9f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_a8), bVar2) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa85144);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (char *)0xa8515d);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffeb8,in_RCX);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c);
    QDebug::operator<<(in_stack_fffffffffffffeb8,in_RCX);
    QScrollerPrivate::stateName(pQVar4->state);
    QDebug::operator<<(in_stack_fffffffffffffeb8,in_RCX);
    o = QDebug::operator<<(in_stack_fffffffffffffeb8,in_RCX);
    QDebug::QDebug(&local_b8,o);
    ::operator<<((QDebug *)&local_b0,(QPointF *)&local_b8);
    QDebug::operator<<(in_stack_fffffffffffffeb8,in_RCX);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (char)((uint)in_stack_fffffffffffffe9c >> 0x18));
    QDebug::~QDebug(&local_b0);
    QDebug::~QDebug(&local_b8);
    QDebug::~QDebug(&local_c0);
    local_a0 = 0;
  }
  memcpy(local_98,&DAT_00d36960,0x90);
  local_124 = 0;
  do {
    if (5 < local_124) {
      local_f1 = false;
LAB_00a8537d:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_f1;
    }
    lVar5 = (long)local_124;
    if ((pQVar4->state == local_98[lVar5 * 6]) && (in_ESI == local_98[lVar5 * 6 + 1])) {
      p1 = (QPointF *)auStack_90[lVar5 * 3];
      uVar1 = auStack_90[lVar5 * 3 + 1];
      if (((ulong)p1 & 1) != 0) {
        p1 = *(QPointF **)((long)p1 + *(long *)(&pQVar4->super_QObject + uVar1) + -1);
      }
      local_f0[0] = ::operator-(p1,(QPointF *)
                                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      bVar3 = (*(code *)p1)(&pQVar4->super_QObject + uVar1,local_f0,in_RCX);
      local_f1 = (bool)(bVar3 & 1);
      goto LAB_00a8537d;
    }
    local_124 = local_124 + 1;
  } while( true );
}

Assistant:

bool QScroller::handleInput(Input input, const QPointF &position, qint64 timestamp)
{
    Q_D(QScroller);

    qCDebug(lcScroller) << "QScroller::handleInput(" << input << ", " << d->stateName(d->state)
                        << ", " << position << ", " << timestamp << ')';
    struct statechange {
        State state;
        Input input;
        typedef bool (QScrollerPrivate::*inputhandler_t)(const QPointF &position, qint64 timestamp);
        inputhandler_t handler;
    };

    statechange statechanges[] = {
        { QScroller::Inactive,  InputPress,   &QScrollerPrivate::pressWhileInactive },
        { QScroller::Pressed,   InputMove,    &QScrollerPrivate::moveWhilePressed },
        { QScroller::Pressed,   InputRelease, &QScrollerPrivate::releaseWhilePressed },
        { QScroller::Dragging,  InputMove,    &QScrollerPrivate::moveWhileDragging },
        { QScroller::Dragging,  InputRelease, &QScrollerPrivate::releaseWhileDragging },
        { QScroller::Scrolling, InputPress,   &QScrollerPrivate::pressWhileScrolling }
    };

    for (int i = 0; i < int(sizeof(statechanges) / sizeof(*statechanges)); ++i) {
        statechange *sc = statechanges + i;

         if (d->state == sc->state && input == sc->input)
             return (d->*sc->handler)(position - d->overshootPosition, timestamp);
    }
    return false;
}